

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ManStaticFanoutTest(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  int iVar1;
  int *piVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  int iVar6;
  
  Gia_ManStaticFanoutStart(p);
  if (p->nObjs < 1) {
LAB_0020922a:
    Gia_ManStaticFanoutStop(p);
    return;
  }
  lVar5 = 0;
LAB_0020912f:
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    pObj = p->pObjs + lVar5;
    Gia_ObjPrint(p,pObj);
    printf("   Fanouts : ");
    pGVar4 = p->pObjs;
    if (pObj < pGVar4) {
LAB_0020925f:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar6 = 0;
    do {
      if (pGVar4 + p->nObjs <= pObj) goto LAB_0020925f;
      uVar3 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar3 < 0) || (p->vFanoutNums->nSize <= (int)uVar3)) {
LAB_00209240:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vFanoutNums->pArray[uVar3 & 0x7fffffff] <= iVar6) goto LAB_00209210;
      iVar1 = p->vFanout->nSize;
      if (iVar1 <= (int)uVar3) goto LAB_00209240;
      piVar2 = p->vFanout->pArray;
      uVar3 = piVar2[uVar3 & 0x7fffffff] + iVar6;
      if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) goto LAB_00209240;
      iVar1 = piVar2[uVar3];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      printf("%5d ");
      iVar6 = iVar6 + 1;
      pGVar4 = p->pObjs;
      if (pObj < pGVar4) goto LAB_0020925f;
    } while( true );
  }
  goto LAB_0020922a;
LAB_00209210:
  putchar(10);
  lVar5 = lVar5 + 1;
  if (p->nObjs <= lVar5) goto LAB_0020922a;
  goto LAB_0020912f;
}

Assistant:

void Gia_ManStaticFanoutTest( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanout;
    int i, k;
    Gia_ManStaticFanoutStart( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjPrint( p, pObj );
        printf( "   Fanouts : " );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
            printf( "%5d ", Gia_ObjId(p, pFanout) );
        printf( "\n" );
    }
    Gia_ManStaticFanoutStop( p );
}